

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parsedoffset.cc
# Opt level: O3

int main(int argc,char **argv)

{
  pointer ppVar1;
  long lVar2;
  ostream *poVar3;
  pointer pvVar4;
  ulong uVar5;
  ulong uVar6;
  pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *iter;
  pointer ppVar7;
  vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  table;
  allocator<char> local_69;
  vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_68;
  string local_50;
  
  if (argc == 2) {
    local_68.
    super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,argv[1],&local_69);
    process(&local_50,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_68.
        super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_68.
        super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar6 = 0;
      pvVar4 = local_68.
               super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        ppVar7 = pvVar4[uVar6].
                 super__Vector_base<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar1 = pvVar4[uVar6].
                 super__Vector_base<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((long)ppVar1 - (long)ppVar7 != 0) {
          uVar5 = ((long)ppVar1 - (long)ppVar7 >> 3) * -0x3333333333333333;
          lVar2 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long_long,std::__cxx11::string>*,std::vector<std::pair<long_long,std::__cxx11::string>,std::allocator<std::pair<long_long,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (ppVar7,ppVar1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long_long,std::__cxx11::string>*,std::vector<std::pair<long_long,std::__cxx11::string>,std::allocator<std::pair<long_long,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (ppVar7,ppVar1);
          if (uVar6 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"--- objects not in streams ---",0x1e);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
            std::ostream::put(-0x60);
            std::ostream::flush();
            pvVar4 = local_68.
                     super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"--- objects in stream ",0x16);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," ---",4);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            pvVar4 = local_68.
                     super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar6;
          }
          ppVar1 = (pvVar4->
                   super__Vector_base<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          ppVar7 = (pvVar4->
                   super__Vector_base<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pvVar4 = local_68.
                   super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          for (; local_68.
                 super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start = pvVar4, ppVar7 != ppVar1;
              ppVar7 = ppVar7 + 1) {
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(ppVar7->second)._M_dataplus._M_p,
                                (ppVar7->second)._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            pvVar4 = local_68.
                     super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)(((long)local_68.
                                      super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3
                               ) * -0x5555555555555555));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"succeeded",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::
    vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector(&local_68);
    return 0;
  }
  usage();
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 2) {
        usage();
        std::exit(2);
    }

    try {
        std::vector<std::vector<std::pair<qpdf_offset_t, std::string>>> table;

        process(argv[1], table);

        for (size_t i = 0; i < table.size(); ++i) {
            if (table[i].size() == 0) {
                continue;
            }

            std::sort(table[i].begin(), table[i].end());
            if (i == 0) {
                std::cout << "--- objects not in streams ---" << std::endl;
            } else {
                std::cout << "--- objects in stream " << i << " ---" << std::endl;
            }

            for (auto const& iter: table[i]) {
                std::cout << iter.second << std::endl;
            }
        }

        std::cout << "succeeded" << std::endl;
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        std::exit(2);
    }

    return 0;
}